

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError TestParameters(PaUtilHostApiRepresentation *hostApi,PaStreamParameters *parameters,
                      double sampleRate,StreamDirection streamDir)

{
  undefined8 uVar1;
  long lVar2;
  double sampleRate_00;
  snd_pcm_t *psVar3;
  int iVar4;
  int iVar5;
  snd_pcm_format_t sVar6;
  PaError PVar7;
  size_t __n;
  PaSampleFormat availableFormats;
  PaSampleFormat PVar8;
  pthread_t pVar9;
  char *pcVar10;
  snd_pcm_hw_params_t *hwParams;
  int __pa_unsure_error_id;
  undefined8 uStack_50;
  snd_pcm_hw_params_t asStack_48 [8];
  double local_40;
  snd_pcm_t *local_38;
  snd_pcm_t *pcm;
  
  local_38 = (snd_pcm_t *)0x0;
  uStack_50 = 0x10e253;
  local_40 = sampleRate;
  __n = snd_pcm_hw_params_sizeof();
  lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
  hwParams = asStack_48 + lVar2;
  *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e271;
  memset(hwParams,0,__n);
  if (parameters->hostApiSpecificStreamInfo == (void *)0x0) {
    iVar5 = *(int *)((long)&hostApi->deviceInfos[parameters->device][1].name +
                    (ulong)(streamDir != StreamDirection_In) * 4 + 4);
    if (iVar5 < parameters->channelCount) {
      iVar5 = parameters->channelCount;
    }
  }
  else {
    iVar5 = parameters->channelCount;
  }
  *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e2b4;
  paUtilErr_ = AlsaOpen(hostApi,parameters,streamDir,&local_38);
  psVar3 = local_38;
  if (paUtilErr_ < 0) {
    pcVar10 = 
    "Expression \'AlsaOpen( hostApi, parameters, streamDir, &pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1767\n"
    ;
  }
  else {
    *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e2ce;
    snd_pcm_hw_params_any(psVar3,hwParams);
    psVar3 = local_38;
    sampleRate_00 = local_40;
    *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e2df;
    iVar4 = SetApproximateSampleRate(psVar3,hwParams,sampleRate_00);
    psVar3 = local_38;
    if (iVar4 < 0) {
      PVar7 = -0x270d;
      goto LAB_0010e3c4;
    }
    *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e2f6;
    iVar5 = snd_pcm_hw_params_set_channels(psVar3,hwParams,iVar5);
    psVar3 = local_38;
    if (iVar5 < 0) {
      PVar7 = -0x270e;
      goto LAB_0010e3c4;
    }
    *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e307;
    availableFormats = GetAvailableFormats(psVar3);
    PVar8 = parameters->sampleFormat;
    *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e313;
    PVar8 = PaUtil_SelectClosestAvailableFormat(availableFormats,PVar8);
    psVar3 = local_38;
    paUtilErr_ = (PaError)PVar8;
    if (-1 < paUtilErr_) {
      *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e32d;
      sVar6 = Pa2AlsaFormat(PVar8);
      *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e33a;
      iVar5 = snd_pcm_hw_params_set_format(psVar3,hwParams,sVar6);
      psVar3 = local_38;
      if (iVar5 < 0) {
        *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e40a;
        pVar9 = pthread_self();
        *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e41c;
        iVar4 = pthread_equal(pVar9,paUnixMainThread);
        if (iVar4 != 0) {
          *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e42b;
          pcVar10 = (char *)snd_strerror(iVar5);
          *(undefined8 *)(asStack_48 + lVar2 + -8) = 8;
          uVar1 = *(undefined8 *)(asStack_48 + lVar2 + -8);
          *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e439;
          PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar1,(long)iVar5,pcVar10);
        }
        *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e447;
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_hw_params_set_format( pcm, hwParams, Pa2AlsaFormat( hostFormat ) )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1788\n"
                         );
        PVar7 = -9999;
      }
      else {
        *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e34e;
        iVar5 = snd_pcm_hw_params(psVar3,hwParams);
        PVar7 = 0;
        if ((iVar5 < 0) && (PVar7 = -0x2709, iVar5 != -0x16)) {
          PVar7 = -0x2701;
          if (iVar5 != -0x10) {
            *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e379;
            pVar9 = pthread_self();
            *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e38b;
            iVar4 = pthread_equal(pVar9,paUnixMainThread);
            PVar7 = -9999;
            if (iVar4 != 0) {
              *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e39a;
              pcVar10 = (char *)snd_strerror(iVar5);
              *(undefined8 *)(asStack_48 + lVar2 + -8) = 8;
              uVar1 = *(undefined8 *)(asStack_48 + lVar2 + -8);
              *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e3a8;
              PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar1,(long)iVar5,pcVar10);
            }
          }
          *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e3b6;
          PaUtil_DebugPrint(
                           "Expression \'ret\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1811\n"
                           );
        }
      }
      goto LAB_0010e3c4;
    }
    pcVar10 = 
    "Expression \'hostFormat = PaUtil_SelectClosestAvailableFormat( availableFormats, parameters->sampleFormat )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1785\n"
    ;
  }
  *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e3fa;
  PaUtil_DebugPrint(pcVar10);
  PVar7 = paUtilErr_;
LAB_0010e3c4:
  if (local_38 != (snd_pcm_t *)0x0) {
    *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x10e3d2;
    snd_pcm_close();
  }
  return PVar7;
}

Assistant:

static PaError TestParameters( const PaUtilHostApiRepresentation *hostApi, const PaStreamParameters *parameters,
        double sampleRate, StreamDirection streamDir )
{
    PaError result = paNoError;
    snd_pcm_t *pcm = NULL;
    PaSampleFormat availableFormats;
    /* We are able to adapt to a number of channels less than what the device supports */
    unsigned int numHostChannels;
    PaSampleFormat hostFormat;
    snd_pcm_hw_params_t *hwParams;
    alsa_snd_pcm_hw_params_alloca( &hwParams );

    if( !parameters->hostApiSpecificStreamInfo )
    {
        const PaAlsaDeviceInfo *devInfo = GetDeviceInfo( hostApi, parameters->device );
        numHostChannels = PA_MAX( parameters->channelCount, StreamDirection_In == streamDir ?
                devInfo->minInputChannels : devInfo->minOutputChannels );
    }
    else
        numHostChannels = parameters->channelCount;

    PA_ENSURE( AlsaOpen( hostApi, parameters, streamDir, &pcm ) );

    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    if( SetApproximateSampleRate( pcm, hwParams, sampleRate ) < 0 )
    {
        result = paInvalidSampleRate;
        goto error;
    }

    if( alsa_snd_pcm_hw_params_set_channels( pcm, hwParams, numHostChannels ) < 0 )
    {
        result = paInvalidChannelCount;
        goto error;
    }

    /* See if we can find a best possible match */
    availableFormats = GetAvailableFormats( pcm );
    PA_ENSURE( hostFormat = PaUtil_SelectClosestAvailableFormat( availableFormats, parameters->sampleFormat ) );

    /* Some specific hardware (reported: Audio8 DJ) can fail with assertion during this step. */
    ENSURE_( alsa_snd_pcm_hw_params_set_format( pcm, hwParams, Pa2AlsaFormat( hostFormat ) ), paUnanticipatedHostError );

    {
        /* It happens that this call fails because the device is busy */
        int ret = 0;
        if( ( ret = alsa_snd_pcm_hw_params( pcm, hwParams ) ) < 0 )
        {
            if( -EINVAL == ret )
            {
                /* Don't know what to return here */
                result = paBadIODeviceCombination;
                goto error;
            }
            else if( -EBUSY == ret )
            {
                result = paDeviceUnavailable;
                PA_DEBUG(( "%s: Device is busy\n", __FUNCTION__ ));
            }
            else
            {
                result = paUnanticipatedHostError;
            }

            ENSURE_( ret, result );
        }
    }

end:
    if( pcm )
    {
        alsa_snd_pcm_close( pcm );
    }
    return result;

error:
    goto end;
}